

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O0

void __thiscall
llvm::StringMap<llbuild::core::KeyID,_llvm::MallocAllocator>::~StringMap
          (StringMap<llbuild::core::KeyID,_llvm::MallocAllocator> *this)

{
  uint uVar1;
  StringMapEntry<llbuild::core::KeyID> *this_00;
  bool bVar2;
  StringMapEntry<llbuild::core::KeyID> *pSVar3;
  StringMapEntryBase *Bucket;
  uint E;
  uint I;
  StringMap<llbuild::core::KeyID,_llvm::MallocAllocator> *this_local;
  
  bVar2 = StringMapImpl::empty(&this->super_StringMapImpl);
  if (!bVar2) {
    Bucket._4_4_ = 0;
    uVar1 = (this->super_StringMapImpl).NumBuckets;
    for (; Bucket._4_4_ != uVar1; Bucket._4_4_ = Bucket._4_4_ + 1) {
      this_00 = (StringMapEntry<llbuild::core::KeyID> *)
                (this->super_StringMapImpl).TheTable[Bucket._4_4_];
      if ((this_00 != (StringMapEntry<llbuild::core::KeyID> *)0x0) &&
         (pSVar3 = (StringMapEntry<llbuild::core::KeyID> *)StringMapImpl::getTombstoneVal(),
         this_00 != pSVar3)) {
        StringMapEntry<llbuild::core::KeyID>::Destroy<llvm::MallocAllocator>
                  (this_00,(MallocAllocator *)&this->field_0x18);
      }
    }
  }
  free((this->super_StringMapImpl).TheTable);
  return;
}

Assistant:

~StringMap() {
    // Delete all the elements in the map, but don't reset the elements
    // to default values.  This is a copy of clear(), but avoids unnecessary
    // work not required in the destructor.
    if (!empty()) {
      for (unsigned I = 0, E = NumBuckets; I != E; ++I) {
        StringMapEntryBase *Bucket = TheTable[I];
        if (Bucket && Bucket != getTombstoneVal()) {
          static_cast<MapEntryTy*>(Bucket)->Destroy(Allocator);
        }
      }
    }
    free(TheTable);
  }